

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plt-elf.c
# Opt level: O0

undefined1 * plt_get_real_fn(plt_ctx ctx,char *name)

{
  Elf64_Sym *pEVar1;
  Elf64_Sym *sym;
  link_map *lm;
  char *name_local;
  plt_ctx ctx_local;
  
  sym = (Elf64_Sym *)ctx->r_map;
  while( true ) {
    if (sym == (Elf64_Sym *)0x0) {
      return (undefined1 *)0x0;
    }
    pEVar1 = sym_lookup_dyn((plt_lib)sym,name);
    if ((pEVar1 != (Elf64_Sym *)0x0) && (pEVar1->st_size != 0)) break;
    sym = *(Elf64_Sym **)(sym + 1);
  }
  return (undefined1 *)(pEVar1->st_value + *(long *)sym);
}

Assistant:

plt_fn *plt_get_real_fn(plt_ctx ctx, const char *name)
{
    for (struct link_map *lm = ctx->r_map; lm != NULL; lm = lm->l_next) {
        ElfW(Sym) *sym = sym_lookup_dyn(lm, name);
        if (sym) {
            /* Some compilers (e.g. ICC) put unresolved symbols into the
               symbol table with a size of 0. We ignore them to avoid
               getting the address of the PLT stub. */
            if (sym->st_size == 0)
                continue;

            return (void *) (sym->st_value + lm->l_addr);
        }
    }
    return NULL;
}